

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DP.c
# Opt level: O0

DoublePrecision
pnga_ddot_patch_dp(Integer g_a,char *t_a,Integer ailo,Integer aihi,Integer ajlo,Integer ajhi,
                  Integer g_b,char *t_b,Integer bilo,Integer bihi,Integer bjlo,Integer bjhi)

{
  char cVar1;
  char cVar2;
  char cVar3;
  logical lVar4;
  long in_RCX;
  long in_RDX;
  char *in_RSI;
  Integer in_RDI;
  long in_R8;
  long in_R9;
  Integer in_stack_00000008;
  char *in_stack_00000010;
  long in_stack_00000018;
  Integer dims [2];
  Integer ndim;
  DoublePrecision *dbl_ptrB;
  DoublePrecision *dbl_ptrA;
  DoublePrecision sum;
  char transp_b;
  char transp_a;
  Integer in_stack_00000050;
  char transp;
  Integer nelem;
  Integer corr;
  Integer temp_created;
  Integer j;
  Integer i;
  Integer me;
  Integer g_A;
  Integer bhi [2];
  Integer blo [2];
  Integer ahi [2];
  Integer alo [2];
  Integer ldB;
  Integer jhiB;
  Integer jloB;
  Integer ihiB;
  Integer iloB;
  Integer ldA;
  Integer jhiA;
  Integer jloA;
  Integer ihiA;
  Integer iloA;
  Integer bdim2;
  Integer bdim1;
  Integer adim2;
  Integer adim1;
  Integer btype;
  Integer atype;
  Integer *in_stack_00000188;
  Integer *in_stack_00000260;
  void *in_stack_00000268;
  Integer *in_stack_00000270;
  Integer *in_stack_00000278;
  Integer in_stack_00000280;
  Integer *jhip;
  int in_stack_fffffffffffffe8c;
  undefined6 in_stack_fffffffffffffe90;
  undefined1 uVar5;
  undefined1 uVar6;
  long local_168;
  long local_160;
  void *local_150;
  long in_stack_fffffffffffffeb8;
  double jlo;
  undefined5 in_stack_fffffffffffffec8;
  long local_118;
  long local_110;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  char *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pnga_nodeid();
  jlo = 0.0;
  pnga_check_handle(me,(char *)i);
  pnga_check_handle(me,(char *)i);
  pnga_inquire(blo[0],(Integer *)bhi[1],(Integer *)bhi[0],(Integer *)g_A);
  local_48 = local_168;
  local_50 = local_160;
  pnga_inquire(blo[0],(Integer *)bhi[1],(Integer *)bhi[0],(Integer *)g_A);
  local_58 = local_168;
  local_60 = local_160;
  if ((local_38 != local_40) || (local_38 != 0x3ec)) {
    pnga_error((char *)dims[0],in_stack_00000018);
  }
  if ((((local_18 < 1) || (local_48 < local_20)) || (local_28 < 1)) || (local_50 < local_30)) {
    pnga_error((char *)dims[0],in_stack_00000018);
  }
  if (((in_stack_00000018 < 1) || (local_58 < dims[0])) || ((dims[1] < 1 || (local_60 < ndim)))) {
    pnga_error((char *)dims[0],in_stack_00000018);
  }
  uVar6 = true;
  if (*local_10 != 'n') {
    uVar6 = *local_10 == 'N';
  }
  cVar1 = 't';
  if ((bool)uVar6 != false) {
    cVar1 = 'n';
  }
  uVar5 = true;
  if (*in_stack_00000010 != 'n') {
    uVar5 = *in_stack_00000010 == 'N';
  }
  cVar2 = 't';
  if ((bool)uVar5 != false) {
    cVar2 = 'n';
  }
  cVar3 = 't';
  if (cVar1 == cVar2) {
    cVar3 = 'n';
  }
  if (cVar3 == 't') {
    pnga_error((char *)dims[0],in_stack_00000018);
  }
  pnga_distribution(bilo,(Integer)t_b,(Integer *)g_b,in_stack_00000188);
  local_68 = local_c8;
  local_78 = local_c0;
  local_70 = local_d8;
  local_80 = local_d0;
  jhip = &local_80;
  lVar4 = patch_intersect(local_18,local_20,local_28,local_30,&local_68,&local_70,&local_78,jhip);
  if (lVar4 != 0) {
    pnga_access_ptr(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268,
                    in_stack_00000260);
    local_e8 = local_68 + (in_stack_00000018 - local_18);
    local_f8 = local_70 + (in_stack_00000018 - local_18);
    local_28 = dims[1] - local_28;
    local_e0 = local_78 + local_28;
    local_f0 = local_80 + local_28;
    local_a8 = local_f0;
    local_a0 = local_e0;
    local_98 = local_f8;
    local_90 = local_e8;
    lVar4 = own_patch(local_28,((local_70 - local_68) + 1) * ((local_80 - local_78) + 1),
                      CONCAT17(cVar3,CONCAT16(cVar1,CONCAT15(cVar2,in_stack_fffffffffffffec8))),
                      (Integer)jlo,in_stack_fffffffffffffeb8);
    if (lVar4 == 0) {
      local_150 = pnga_malloc(CONCAT17(uVar6,CONCAT16(uVar5,in_stack_fffffffffffffe90)),
                              in_stack_fffffffffffffe8c,(char *)jhip);
      local_b0 = (local_98 - local_90) + 1;
      pnga_get(in_stack_00000050,(Integer *)sum,(Integer *)dbl_ptrA,dbl_ptrB,(Integer *)ndim);
    }
    else {
      pnga_access_ptr(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268,
                      in_stack_00000260);
    }
    jlo = 0.0;
    for (local_118 = 0; local_118 < (local_80 - local_78) + 1; local_118 = local_118 + 1) {
      for (local_110 = 0; local_110 < (local_70 - local_68) + 1; local_110 = local_110 + 1) {
        jlo = *(double *)(in_stack_fffffffffffffeb8 + local_118 * local_88 * 8 + local_110 * 8) *
              *(double *)((long)local_150 + local_110 * 8 + local_118 * local_b0 * 8) + jlo;
      }
    }
    pnga_release(in_RDI,&local_c8,&local_d8);
    if (lVar4 == 0) {
      pnga_free((void *)0x250da4);
    }
    else {
      pnga_release(in_stack_00000008,&local_e8,&local_f8);
    }
  }
  return jlo;
}

Assistant:

DoublePrecision pnga_ddot_patch_dp(g_a, t_a, ailo, aihi, ajlo, ajhi,
                                  g_b, t_b, bilo, bihi, bjlo, bjhi)
     Integer g_a, ailo, aihi, ajlo, ajhi;    /* patch of g_a */
     Integer g_b, bilo, bihi, bjlo, bjhi;    /* patch of g_b */
     char    *t_a, *t_b;                          /* transpose operators */
{
Integer atype, btype, adim1, adim2, bdim1, bdim2;
Integer iloA, ihiA, jloA, jhiA, ldA;
Integer iloB, ihiB, jloB, jhiB, ldB;
Integer alo[2], ahi[2];
Integer blo[2], bhi[2];
Integer g_A = g_a;
Integer me= pnga_nodeid(), i, j, temp_created=0;
Integer corr, nelem;
char    transp, transp_a, transp_b;
DoublePrecision  sum = 0.;
DoublePrecision *dbl_ptrA;
DoublePrecision *dbl_ptrB;
Integer ndim, dims[2];

   pnga_check_handle(g_a, "pnga_ddot_patch_dp");
   pnga_check_handle(g_b, "pnga_ddot_patch_dp");

   pnga_inquire(g_a, &atype, &ndim, dims);
   adim1 = dims[0];
   adim2 = dims[1];
   pnga_inquire(g_b, &btype, &ndim, dims);
   bdim1 = dims[0];
   bdim2 = dims[1];

   if(atype != btype || (atype != C_DBL ))
      pnga_error("pnga_ddot_patch_dp: wrong types ", 0L);

  /* check if patch indices and g_a dims match */
   if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
      pnga_error(" pnga_ddot_patch_dp: g_a indices out of range ", 0L);

   /* check if patch indices and g_b dims match */
   if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
       pnga_error(" pnga_ddot_patch_dp: g_b indices out of range ", 0L);


   /* is transpose operation required ? */
   /* -- only if for one array transpose operation requested*/
   transp_a = (*t_a == 'n' || *t_a =='N')? 'n' : 't';
   transp_b = (*t_b == 'n' || *t_b =='N')? 'n' : 't';
   transp   = (transp_a == transp_b)? 'n' : 't';
   if(transp == 't')
          pnga_error(" pnga_ddot_patch_dp: transpose operators don't match: ", me);


   /* find out coordinates of patches of g_A and g_B that I own */
   pnga_distribution(g_A, me, alo, ahi);
   iloA = alo[0];
   jloA = alo[1];
   ihiA = ahi[0];
   jhiA = ahi[1];

   if (patch_intersect(ailo, aihi, ajlo, ajhi, &iloA, &ihiA, &jloA, &jhiA)){

       pnga_access_ptr(g_A, alo, ahi, &dbl_ptrA, &ldA);
       nelem = (ihiA-iloA+1)*(jhiA-jloA+1);

       corr  = bilo - ailo;
       iloB  = iloA + corr;
       ihiB  = ihiA + corr;
       corr  = bjlo - ajlo;
       jloB  = jloA + corr;
       jhiB  = jhiA + corr;
       blo[0] = iloB; blo[1] = jloB;
       bhi[0] = ihiB; bhi[1] = jhiB;

      if(own_patch(g_b, iloB, ihiB, jloB, jhiB)){
         /* all the data is local */
         pnga_access_ptr(g_b, blo, bhi, &dbl_ptrB, &ldB);
      }else{
         /* data is remote -- get it to temp storage*/
         temp_created =1;
	      dbl_ptrB = (DoublePrecision*)pnga_malloc(nelem, MT_F_DBL, "ddot_dp_b");

         ldB   = ihiB-iloB+1; 
         pnga_get(g_b, blo, bhi, dbl_ptrB, &ldB);
      }

      sum = 0.;
      for(j=0; j< jhiA-jloA+1; j++)
          for(i=0; i< ihiA-iloA+1; i++)
             sum += *(dbl_ptrA + j*ldA + i) * 
                    *(dbl_ptrB + j*ldB + i);
      pnga_release(g_A, alo, ahi);

      if(temp_created) pnga_free(dbl_ptrB);
      else pnga_release(g_b, blo, bhi);
   }
   return sum;
}